

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<KNNClassifier> * __thiscall
pybind11::class_<KNNClassifier>::
def<void(KNNClassifier::*)(Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,_1,1,_1,_1>)>
          (class_<KNNClassifier> *this,char *name_,offset_in_KNNClassifier_to_subr *f)

{
  offset_in_KNNClassifier_to_subr f_00;
  name *extra;
  cpp_function cf;
  handle local_68;
  handle local_60;
  handle local_58;
  handle local_50;
  object local_48;
  is_method local_40;
  handle local_38;
  handle local_30;
  object local_28;
  
  f_00 = *f;
  extra = (name *)f[1];
  local_50.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_40.class_.m_ptr = (handle)(handle)name_;
  local_68.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_68.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_68.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_60.m_ptr = local_68.m_ptr;
  cpp_function::
  cpp_function<void,KNNClassifier,Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,_1,1,_1,_1>,pybind11::name,pybind11::is_method,pybind11::sibling>
            ((cpp_function *)&local_58,f_00,extra,&local_40,(sibling *)&local_50);
  object::~object((object *)&local_68);
  object::~object(&local_48);
  cpp_function::name((cpp_function *)&local_60);
  local_38.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  if (local_60.m_ptr != (PyObject *)0x0) {
    (local_60.m_ptr)->ob_refcnt = (local_60.m_ptr)->ob_refcnt + 1;
  }
  local_30.m_ptr = local_60.m_ptr;
  local_50.m_ptr = (PyObject *)0x0;
  local_28.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object((object *)&local_50);
  detail::accessor_policies::obj_attr::set(local_38,local_30,local_58);
  object::~object(&local_28);
  object::~object((object *)&local_30);
  object::~object((object *)&local_60);
  object::~object((object *)&local_58);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }